

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltalloc.cc
# Opt level: O0

void * ltmemalign(size_t align,size_t size)

{
  void *pvVar1;
  size_t size_local;
  size_t align_local;
  
  pvVar1 = ltmalloc(size + (align - 1) & (align - 1 ^ 0xffffffffffffffff));
  return pvVar1;
}

Assistant:

void* ltmemalign(size_t align, size_t size) {
#ifdef LTALLOC_OVERFLOW_DETECTION
	size_t align_minus_one = align - 1;
	void* p = ltmalloc(((size + LTALLOC_CANARY_SIZE + align_minus_one) & ~align_minus_one) - LTALLOC_CANARY_SIZE);
	LTALLOC_ASSERT(((uintptr_t)p % align) == 0);
	return p;
#else
	return --align, ltmalloc((size + align) & ~align);
#endif
}